

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_editor.cpp
# Opt level: O0

size_t __thiscall cmd_obj::render(cmd_obj *this,size_t buf_idx,size_t limit,string *sequence)

{
  string *psVar1;
  size_t sVar2;
  undefined1 local_b8 [64];
  undefined1 local_78 [80];
  string *local_28;
  string *sequence_local;
  size_t limit_local;
  size_t buf_idx_local;
  cmd_obj *this_local;
  
  local_28 = sequence;
  sequence_local = (string *)limit;
  limit_local = buf_idx;
  buf_idx_local = (size_t)this;
  sVar2 = libchars::edit_object::length(&this->super_edit_object);
  if (sVar2 < buf_idx + limit) {
    sVar2 = libchars::edit_object::length(&this->super_edit_object);
    sequence_local = (string *)(sVar2 - limit_local);
  }
  psVar1 = local_28;
  if (limit_local < 10) {
    std::__cxx11::string::assign((char *)local_28);
    psVar1 = local_28;
    if (sequence_local + limit_local < (string *)0xb) {
      value_abi_cxx11_((cmd_obj *)local_78);
      std::__cxx11::string::append((string *)psVar1,(ulong)local_78,limit_local);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::append((char *)local_28);
    }
    else {
      value_abi_cxx11_((cmd_obj *)(local_b8 + 0x20));
      std::__cxx11::string::append((string *)psVar1,(ulong)(local_b8 + 0x20),limit_local);
      std::__cxx11::string::~string((string *)(local_b8 + 0x20));
      std::__cxx11::string::append((char *)local_28);
      psVar1 = local_28;
      value_abi_cxx11_((cmd_obj *)local_b8);
      std::__cxx11::string::append((string *)psVar1,(ulong)local_b8,10);
      std::__cxx11::string::~string((string *)local_b8);
    }
  }
  else {
    value_abi_cxx11_((cmd_obj *)(local_78 + 0x30));
    std::__cxx11::string::assign((string *)psVar1,(ulong)(local_78 + 0x30),limit_local);
    std::__cxx11::string::~string((string *)(local_78 + 0x30));
  }
  return (size_t)sequence_local;
}

Assistant:

virtual size_t render(size_t buf_idx, size_t limit, std::string &sequence)
    {
        if ((buf_idx + limit) > length())
            limit = length() - buf_idx;

        if (buf_idx >= 10) {
            sequence.assign(value(), buf_idx, limit);
        }
        else {
            sequence.assign(COLOR_KEYWORD);
            if ((buf_idx + limit) <= 10) {
                sequence.append(value(), buf_idx, limit);
                sequence.append(COLOR_NORMAL);
            }
            else {
                sequence.append(value(), buf_idx, 10 - buf_idx);
                sequence.append(COLOR_NORMAL);
                sequence.append(value(), 10, limit - (10 - buf_idx));
            }
        }

        return limit;
    }